

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O1

void __thiscall ParserTest_Comments_Test::~ParserTest_Comments_Test(ParserTest_Comments_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTest, Comments) {
  P parser;
  EXPECT_TRUE(parser.parse("// single line comment\n"));
  EXPECT_TRUE(parser.parse("// single line comment nonl"));
  EXPECT_TRUE(parser.parse("/* multi-line comment */"));
  EXPECT_TRUE(parser.parse("prop = /* comment */ 'val'"));
  EXPECT_TRUE(parser.parse("prop = /*/ comment */ 'val'"));
  EXPECT_TRUE(parser.parse("prop = /**/ 'val'"));
  EXPECT_TRUE(parser.parse("prop = /* comment /*nest*/ more */ 'val'"));
  EXPECT_TRUE(parser.parse("elem.id /* comment */ {prop = 'val'}"));
  EXPECT_FALSE(parser.parse("elem.id /* comment {prop = 'val'}"));
  EXPECT_TRUE(parser.parse("// comment\nelem { prop = 'val' prop = 'val' }"));
}